

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsHovered(ImRect *bb,ImGuiID id,bool flatten_childs)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool flatten_childs_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  if ((((((GImGui->HoveredId == 0) || (GImGui->HoveredId == id)) ||
        ((GImGui->HoveredIdAllowOverlap & 1U) != 0)) &&
       ((pIVar3 = GetCurrentWindowRead(), pIVar1->HoveredWindow == pIVar3 ||
        ((flatten_childs && (pIVar1->HoveredRootWindow == pIVar3->RootWindow)))))) &&
      ((pIVar1->ActiveId == 0 ||
       ((pIVar1->ActiveId == id || ((pIVar1->ActiveIdAllowOverlap & 1U) != 0)))))) &&
     ((bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar2 &&
      (bVar2 = IsWindowContentHoverable(pIVar1->HoveredRootWindow), bVar2)))) {
    bb_local._7_1_ = true;
  }
  else {
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::IsHovered(const ImRect& bb, ImGuiID id, bool flatten_childs)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId == 0 || g.HoveredId == id || g.HoveredIdAllowOverlap)
    {
        ImGuiWindow* window = GetCurrentWindowRead();
        if (g.HoveredWindow == window || (flatten_childs && g.HoveredRootWindow == window->RootWindow))
            if ((g.ActiveId == 0 || g.ActiveId == id || g.ActiveIdAllowOverlap) && IsMouseHoveringRect(bb.Min, bb.Max))
                if (IsWindowContentHoverable(g.HoveredRootWindow))
                    return true;
    }
    return false;
}